

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

osfildef * CCharmap::open_map_file(CResLoader *res_loader,char *table_name,charmap_type_t *map_type)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long __off;
  size_t sVar4;
  undefined4 *in_RDX;
  undefined8 in_RSI;
  uchar *p;
  size_t cur;
  int found_double;
  int found_single;
  uint entry_cnt;
  uchar buf [256];
  ulong startpos;
  char respath [100];
  osfildef *fp;
  char *in_stack_00002e58;
  char *in_stack_00002e60;
  char *in_stack_00002e68;
  CResLoader *in_stack_00002e70;
  undefined1 *local_1c8;
  ulong local_1c0;
  uint local_1ac;
  undefined1 local_1a8 [4];
  undefined1 auStack_1a4 [180];
  char local_98 [112];
  FILE *local_28;
  undefined4 *local_20;
  FILE *local_8;
  
  local_20 = in_RDX;
  t3sprintf(local_98,100,"charmap/%s.tcm",in_RSI);
  t3strlwr((char *)0x23dd2f);
  local_28 = (FILE *)CResLoader::open_res_file
                               (in_stack_00002e70,in_stack_00002e68,in_stack_00002e60,
                                in_stack_00002e58);
  if (local_28 == (FILE *)0x0) {
    local_8 = (FILE *)0x0;
  }
  else {
    __off = ftell(local_28);
    sVar4 = fread(local_1a8,6,1,local_28);
    if (sVar4 == 1) {
      local_1ac = ::osrp2(auStack_1a4);
      bVar2 = false;
      bVar1 = false;
      do {
        if (local_1ac == 0) break;
        local_1c0 = 0x40;
        if (local_1ac < 0x40) {
          local_1c0 = (ulong)local_1ac;
        }
        sVar4 = fread(local_1a8,local_1c0 << 2,1,local_28);
        if (sVar4 != 1) goto LAB_0023df2b;
        local_1ac = local_1ac - (int)local_1c0;
        local_1c8 = local_1a8;
        for (; local_1c0 != 0; local_1c0 = local_1c0 - 1) {
          uVar3 = ::osrp2(local_1c8 + 2);
          if (uVar3 < 0x100) {
            bVar1 = true;
          }
          else {
            bVar2 = true;
          }
          local_1c8 = local_1c8 + 4;
        }
      } while ((!bVar1) || (!bVar2));
      if ((bVar1) && (bVar2)) {
        *local_20 = 2;
      }
      else if (bVar2) {
        *local_20 = 1;
      }
      else if (bVar1) {
        *local_20 = 0;
      }
      else {
        *local_20 = 0;
      }
      fseek(local_28,__off,0);
      local_8 = local_28;
    }
    else {
LAB_0023df2b:
      fclose(local_28);
      local_8 = (FILE *)0x0;
    }
  }
  return (osfildef *)local_8;
}

Assistant:

osfildef *CCharmap::open_map_file(class CResLoader *res_loader,
                                  const char *table_name,
                                  charmap_type_t *map_type)
{
    osfildef *fp;
    char respath[100];
    ulong startpos;
    uchar buf[256];
    uint entry_cnt;
    int found_single;
    int found_double;

    /*
     *   Generate the full resource path - character mapping resource paths
     *   always start with "charmap/" followed by the table name, plus the
     *   ".tcm" extension.  We use lower-case names for the mapping files, so
     *   explicitly convert to lower, in case we're on a case-sensitive file
     *   system like Unix.  
     */
    t3sprintf(respath, sizeof(respath), "charmap/%s.tcm", table_name);
    t3strlwr(respath);

    /* open the file for the character set */
    fp = res_loader->open_res_file(respath, "charmap/cmaplib", "CLIB");

    /* if we couldn't open the mapping file, return failure */
    if (fp == 0)
        return 0;

    /* note the initial seek position */
    startpos = osfpos(fp);

    /* read the header and the local-to-unicode header */
    if (osfrb(fp, buf, 6))
        goto fail;

    /* get the number of entries from the local-to-unicode header */
    entry_cnt = osrp2(buf + 4);

    /* 
     *   Scan the entries to determine if we have single-byte,
     *   double-byte, or both.  
     */
    found_single = found_double = FALSE;
    while (entry_cnt > 0)
    {
        size_t cur;
        const uchar *p;

        /* read up to a buffer-full or the remaining size */
        cur = sizeof(buf)/4;
        if (cur > entry_cnt)
            cur = entry_cnt;

        /* read it */
        if (osfrb(fp, buf, cur*4))
            goto fail;

        /* deduct the amount we just read from the amount remaining */
        entry_cnt -= cur;

        /* scan the entries */
        for (p = buf ; cur > 0 ; --cur, p += 4)
        {
            /* 
             *   Note whether this is a single-byte or double-byte entry.
             *   If the high-order byte is non-zero, it's a double-byte
             *   entry; otherwise, it's a single-byte entry.
             *   
             *   Note that we read the UINT2 at (p+2), because that's the
             *   local character-set code point in this tuple.  
             */
            if (((uint)osrp2(p + 2)) > 0xFF)
                found_double = TRUE;
            else
                found_single = TRUE;
        }

        /* 
         *   if we've found both single- and double-byte characters so
         *   far, there's no need to look any further, since we know
         *   everything about the file now 
         */
        if (found_single && found_double)
            break;
    }

    /* 
     *   create the appropriate mapper, depending on whether we found
     *   single, double, or mixed characters 
     */
    if (found_single && found_double)
    {
        /* it's mixed */
        *map_type = CHARMAP_TYPE_MB;
    }
    else if (found_double)
    {
        /* it's all double-byte */
        *map_type = CHARMAP_TYPE_DB;
    }
    else if (found_single)
    {
        /* it's all single-byte */
        *map_type = CHARMAP_TYPE_SB;
    }
    else
    {
        /* no mappings found at all - presume it's a single-byte mapper */
        *map_type = CHARMAP_TYPE_SB;
    }

    /* seek back to the start of the table */
    osfseek(fp, startpos, OSFSK_SET);

    /* return the file pointer */
    return fp;

fail:
    /* close the file and return failure */
    osfcls(fp);
    return 0;
}